

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

void stbir__vertical_gather_with_8_coeffs
               (float *outputp,float *vertical_coefficients,float **inputs,float *input0_end)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float o0_2;
  __m128 r0_1;
  __m128 o0_1;
  __m128 r3;
  __m128 r2;
  __m128 r1;
  __m128 r0;
  __m128 o3;
  __m128 o2;
  __m128 o1;
  __m128 o0;
  __m128 c7;
  __m128 c6;
  __m128 c5;
  __m128 c4;
  __m128 c3;
  __m128 c2;
  __m128 c1;
  __m128 c0;
  float *pfStack_d08;
  float c7s;
  float *input7;
  float *pfStack_cf8;
  float c6s;
  float *input6;
  float *pfStack_ce8;
  float c5s;
  float *input5;
  float *pfStack_cd8;
  float c4s;
  float *input4;
  float *pfStack_cc8;
  float c3s;
  float *input3;
  float *pfStack_cb8;
  float c2s;
  float *input2;
  float *pfStack_ca8;
  float c1s;
  float *input1;
  float *pfStack_c98;
  float c0s;
  float *input0;
  float *output;
  float *input0_end_local;
  float **inputs_local;
  float *vertical_coefficients_local;
  float *outputp_local;
  float local_a78;
  float fStack_a74;
  float fStack_a70;
  float fStack_a6c;
  float local_a58;
  float fStack_a54;
  float fStack_a50;
  float fStack_a4c;
  float local_a38;
  float fStack_a34;
  float fStack_a30;
  float fStack_a2c;
  float local_a18;
  float fStack_a14;
  float fStack_a10;
  float fStack_a0c;
  float local_9f8;
  float fStack_9f4;
  float fStack_9f0;
  float fStack_9ec;
  float local_9d8;
  float fStack_9d4;
  float fStack_9d0;
  float fStack_9cc;
  float local_9b8;
  float fStack_9b4;
  float fStack_9b0;
  float fStack_9ac;
  float local_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float local_978;
  float fStack_974;
  float fStack_970;
  float fStack_96c;
  float local_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float local_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float local_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float local_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float local_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float local_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float local_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float local_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float local_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float local_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float local_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float local_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float local_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float local_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float local_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float local_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float local_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float local_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float local_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float local_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float local_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float local_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float local_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float local_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float local_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float local_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float local_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float local_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float local_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float local_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float local_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  
  fVar1 = *vertical_coefficients;
  pfStack_ca8 = inputs[1];
  fVar2 = vertical_coefficients[1];
  pfStack_cb8 = inputs[2];
  fVar3 = vertical_coefficients[2];
  pfStack_cc8 = inputs[3];
  fVar4 = vertical_coefficients[3];
  pfStack_cd8 = inputs[4];
  fVar5 = vertical_coefficients[4];
  pfStack_ce8 = inputs[5];
  fVar6 = vertical_coefficients[5];
  pfStack_cf8 = inputs[6];
  fVar7 = vertical_coefficients[6];
  pfStack_d08 = inputs[7];
  fVar8 = vertical_coefficients[7];
  input0 = outputp;
  for (pfStack_c98 = *inputs; 0x3f < (long)input0_end - (long)pfStack_c98;
      pfStack_c98 = pfStack_c98 + 0x10) {
    local_598 = (float)*(undefined8 *)pfStack_c98;
    fStack_594 = (float)((ulong)*(undefined8 *)pfStack_c98 >> 0x20);
    fStack_590 = (float)*(undefined8 *)(pfStack_c98 + 2);
    fStack_58c = (float)((ulong)*(undefined8 *)(pfStack_c98 + 2) >> 0x20);
    local_5b8 = (float)*(undefined8 *)(pfStack_c98 + 4);
    fStack_5b4 = (float)((ulong)*(undefined8 *)(pfStack_c98 + 4) >> 0x20);
    fStack_5b0 = (float)*(undefined8 *)(pfStack_c98 + 6);
    fStack_5ac = (float)((ulong)*(undefined8 *)(pfStack_c98 + 6) >> 0x20);
    local_5d8 = (float)*(undefined8 *)(pfStack_c98 + 8);
    fStack_5d4 = (float)((ulong)*(undefined8 *)(pfStack_c98 + 8) >> 0x20);
    fStack_5d0 = (float)*(undefined8 *)(pfStack_c98 + 10);
    fStack_5cc = (float)((ulong)*(undefined8 *)(pfStack_c98 + 10) >> 0x20);
    local_5f8 = (float)*(undefined8 *)(pfStack_c98 + 0xc);
    fStack_5f4 = (float)((ulong)*(undefined8 *)(pfStack_c98 + 0xc) >> 0x20);
    fStack_5f0 = (float)*(undefined8 *)(pfStack_c98 + 0xe);
    fStack_5ec = (float)((ulong)*(undefined8 *)(pfStack_c98 + 0xe) >> 0x20);
    local_618 = (float)*(undefined8 *)pfStack_ca8;
    fStack_614 = (float)((ulong)*(undefined8 *)pfStack_ca8 >> 0x20);
    fStack_610 = (float)*(undefined8 *)(pfStack_ca8 + 2);
    fStack_60c = (float)((ulong)*(undefined8 *)(pfStack_ca8 + 2) >> 0x20);
    local_638 = (float)*(undefined8 *)(pfStack_ca8 + 4);
    fStack_634 = (float)((ulong)*(undefined8 *)(pfStack_ca8 + 4) >> 0x20);
    fStack_630 = (float)*(undefined8 *)(pfStack_ca8 + 6);
    fStack_62c = (float)((ulong)*(undefined8 *)(pfStack_ca8 + 6) >> 0x20);
    local_658 = (float)*(undefined8 *)(pfStack_ca8 + 8);
    fStack_654 = (float)((ulong)*(undefined8 *)(pfStack_ca8 + 8) >> 0x20);
    fStack_650 = (float)*(undefined8 *)(pfStack_ca8 + 10);
    fStack_64c = (float)((ulong)*(undefined8 *)(pfStack_ca8 + 10) >> 0x20);
    local_678 = (float)*(undefined8 *)(pfStack_ca8 + 0xc);
    fStack_674 = (float)((ulong)*(undefined8 *)(pfStack_ca8 + 0xc) >> 0x20);
    fStack_670 = (float)*(undefined8 *)(pfStack_ca8 + 0xe);
    fStack_66c = (float)((ulong)*(undefined8 *)(pfStack_ca8 + 0xe) >> 0x20);
    local_698 = (float)*(undefined8 *)pfStack_cb8;
    fStack_694 = (float)((ulong)*(undefined8 *)pfStack_cb8 >> 0x20);
    fStack_690 = (float)*(undefined8 *)(pfStack_cb8 + 2);
    fStack_68c = (float)((ulong)*(undefined8 *)(pfStack_cb8 + 2) >> 0x20);
    local_6b8 = (float)*(undefined8 *)(pfStack_cb8 + 4);
    fStack_6b4 = (float)((ulong)*(undefined8 *)(pfStack_cb8 + 4) >> 0x20);
    fStack_6b0 = (float)*(undefined8 *)(pfStack_cb8 + 6);
    fStack_6ac = (float)((ulong)*(undefined8 *)(pfStack_cb8 + 6) >> 0x20);
    local_6d8 = (float)*(undefined8 *)(pfStack_cb8 + 8);
    fStack_6d4 = (float)((ulong)*(undefined8 *)(pfStack_cb8 + 8) >> 0x20);
    fStack_6d0 = (float)*(undefined8 *)(pfStack_cb8 + 10);
    fStack_6cc = (float)((ulong)*(undefined8 *)(pfStack_cb8 + 10) >> 0x20);
    local_6f8 = (float)*(undefined8 *)(pfStack_cb8 + 0xc);
    fStack_6f4 = (float)((ulong)*(undefined8 *)(pfStack_cb8 + 0xc) >> 0x20);
    fStack_6f0 = (float)*(undefined8 *)(pfStack_cb8 + 0xe);
    fStack_6ec = (float)((ulong)*(undefined8 *)(pfStack_cb8 + 0xe) >> 0x20);
    local_718 = (float)*(undefined8 *)pfStack_cc8;
    fStack_714 = (float)((ulong)*(undefined8 *)pfStack_cc8 >> 0x20);
    fStack_710 = (float)*(undefined8 *)(pfStack_cc8 + 2);
    fStack_70c = (float)((ulong)*(undefined8 *)(pfStack_cc8 + 2) >> 0x20);
    local_738 = (float)*(undefined8 *)(pfStack_cc8 + 4);
    fStack_734 = (float)((ulong)*(undefined8 *)(pfStack_cc8 + 4) >> 0x20);
    fStack_730 = (float)*(undefined8 *)(pfStack_cc8 + 6);
    fStack_72c = (float)((ulong)*(undefined8 *)(pfStack_cc8 + 6) >> 0x20);
    local_758 = (float)*(undefined8 *)(pfStack_cc8 + 8);
    fStack_754 = (float)((ulong)*(undefined8 *)(pfStack_cc8 + 8) >> 0x20);
    fStack_750 = (float)*(undefined8 *)(pfStack_cc8 + 10);
    fStack_74c = (float)((ulong)*(undefined8 *)(pfStack_cc8 + 10) >> 0x20);
    local_778 = (float)*(undefined8 *)(pfStack_cc8 + 0xc);
    fStack_774 = (float)((ulong)*(undefined8 *)(pfStack_cc8 + 0xc) >> 0x20);
    fStack_770 = (float)*(undefined8 *)(pfStack_cc8 + 0xe);
    fStack_76c = (float)((ulong)*(undefined8 *)(pfStack_cc8 + 0xe) >> 0x20);
    local_798 = (float)*(undefined8 *)pfStack_cd8;
    fStack_794 = (float)((ulong)*(undefined8 *)pfStack_cd8 >> 0x20);
    fStack_790 = (float)*(undefined8 *)(pfStack_cd8 + 2);
    fStack_78c = (float)((ulong)*(undefined8 *)(pfStack_cd8 + 2) >> 0x20);
    local_7b8 = (float)*(undefined8 *)(pfStack_cd8 + 4);
    fStack_7b4 = (float)((ulong)*(undefined8 *)(pfStack_cd8 + 4) >> 0x20);
    fStack_7b0 = (float)*(undefined8 *)(pfStack_cd8 + 6);
    fStack_7ac = (float)((ulong)*(undefined8 *)(pfStack_cd8 + 6) >> 0x20);
    local_7d8 = (float)*(undefined8 *)(pfStack_cd8 + 8);
    fStack_7d4 = (float)((ulong)*(undefined8 *)(pfStack_cd8 + 8) >> 0x20);
    fStack_7d0 = (float)*(undefined8 *)(pfStack_cd8 + 10);
    fStack_7cc = (float)((ulong)*(undefined8 *)(pfStack_cd8 + 10) >> 0x20);
    local_7f8 = (float)*(undefined8 *)(pfStack_cd8 + 0xc);
    fStack_7f4 = (float)((ulong)*(undefined8 *)(pfStack_cd8 + 0xc) >> 0x20);
    fStack_7f0 = (float)*(undefined8 *)(pfStack_cd8 + 0xe);
    fStack_7ec = (float)((ulong)*(undefined8 *)(pfStack_cd8 + 0xe) >> 0x20);
    local_818 = (float)*(undefined8 *)pfStack_ce8;
    fStack_814 = (float)((ulong)*(undefined8 *)pfStack_ce8 >> 0x20);
    fStack_810 = (float)*(undefined8 *)(pfStack_ce8 + 2);
    fStack_80c = (float)((ulong)*(undefined8 *)(pfStack_ce8 + 2) >> 0x20);
    local_838 = (float)*(undefined8 *)(pfStack_ce8 + 4);
    fStack_834 = (float)((ulong)*(undefined8 *)(pfStack_ce8 + 4) >> 0x20);
    fStack_830 = (float)*(undefined8 *)(pfStack_ce8 + 6);
    fStack_82c = (float)((ulong)*(undefined8 *)(pfStack_ce8 + 6) >> 0x20);
    local_858 = (float)*(undefined8 *)(pfStack_ce8 + 8);
    fStack_854 = (float)((ulong)*(undefined8 *)(pfStack_ce8 + 8) >> 0x20);
    fStack_850 = (float)*(undefined8 *)(pfStack_ce8 + 10);
    fStack_84c = (float)((ulong)*(undefined8 *)(pfStack_ce8 + 10) >> 0x20);
    local_878 = (float)*(undefined8 *)(pfStack_ce8 + 0xc);
    fStack_874 = (float)((ulong)*(undefined8 *)(pfStack_ce8 + 0xc) >> 0x20);
    fStack_870 = (float)*(undefined8 *)(pfStack_ce8 + 0xe);
    fStack_86c = (float)((ulong)*(undefined8 *)(pfStack_ce8 + 0xe) >> 0x20);
    local_898 = (float)*(undefined8 *)pfStack_cf8;
    fStack_894 = (float)((ulong)*(undefined8 *)pfStack_cf8 >> 0x20);
    fStack_890 = (float)*(undefined8 *)(pfStack_cf8 + 2);
    fStack_88c = (float)((ulong)*(undefined8 *)(pfStack_cf8 + 2) >> 0x20);
    local_8b8 = (float)*(undefined8 *)(pfStack_cf8 + 4);
    fStack_8b4 = (float)((ulong)*(undefined8 *)(pfStack_cf8 + 4) >> 0x20);
    fStack_8b0 = (float)*(undefined8 *)(pfStack_cf8 + 6);
    fStack_8ac = (float)((ulong)*(undefined8 *)(pfStack_cf8 + 6) >> 0x20);
    local_8d8 = (float)*(undefined8 *)(pfStack_cf8 + 8);
    fStack_8d4 = (float)((ulong)*(undefined8 *)(pfStack_cf8 + 8) >> 0x20);
    fStack_8d0 = (float)*(undefined8 *)(pfStack_cf8 + 10);
    fStack_8cc = (float)((ulong)*(undefined8 *)(pfStack_cf8 + 10) >> 0x20);
    local_8f8 = (float)*(undefined8 *)(pfStack_cf8 + 0xc);
    fStack_8f4 = (float)((ulong)*(undefined8 *)(pfStack_cf8 + 0xc) >> 0x20);
    fStack_8f0 = (float)*(undefined8 *)(pfStack_cf8 + 0xe);
    fStack_8ec = (float)((ulong)*(undefined8 *)(pfStack_cf8 + 0xe) >> 0x20);
    local_918 = (float)*(undefined8 *)pfStack_d08;
    fStack_914 = (float)((ulong)*(undefined8 *)pfStack_d08 >> 0x20);
    fStack_910 = (float)*(undefined8 *)(pfStack_d08 + 2);
    fStack_90c = (float)((ulong)*(undefined8 *)(pfStack_d08 + 2) >> 0x20);
    local_938 = (float)*(undefined8 *)(pfStack_d08 + 4);
    fStack_934 = (float)((ulong)*(undefined8 *)(pfStack_d08 + 4) >> 0x20);
    fStack_930 = (float)*(undefined8 *)(pfStack_d08 + 6);
    fStack_92c = (float)((ulong)*(undefined8 *)(pfStack_d08 + 6) >> 0x20);
    local_958 = (float)*(undefined8 *)(pfStack_d08 + 8);
    fStack_954 = (float)((ulong)*(undefined8 *)(pfStack_d08 + 8) >> 0x20);
    fStack_950 = (float)*(undefined8 *)(pfStack_d08 + 10);
    fStack_94c = (float)((ulong)*(undefined8 *)(pfStack_d08 + 10) >> 0x20);
    local_978 = (float)*(undefined8 *)(pfStack_d08 + 0xc);
    fStack_974 = (float)((ulong)*(undefined8 *)(pfStack_d08 + 0xc) >> 0x20);
    fStack_970 = (float)*(undefined8 *)(pfStack_d08 + 0xe);
    fStack_96c = (float)((ulong)*(undefined8 *)(pfStack_d08 + 0xe) >> 0x20);
    *(ulong *)input0 =
         CONCAT44(fStack_594 * fVar1 + fStack_614 * fVar2 + fStack_694 * fVar3 + fStack_714 * fVar4
                  + fStack_794 * fVar5 + fStack_814 * fVar6 + fStack_894 * fVar7 +
                  fStack_914 * fVar8,
                  local_598 * fVar1 + local_618 * fVar2 + local_698 * fVar3 + local_718 * fVar4 +
                  local_798 * fVar5 + local_818 * fVar6 + local_898 * fVar7 + local_918 * fVar8);
    *(ulong *)(input0 + 2) =
         CONCAT44(fStack_58c * fVar1 + fStack_60c * fVar2 + fStack_68c * fVar3 + fStack_70c * fVar4
                  + fStack_78c * fVar5 + fStack_80c * fVar6 + fStack_88c * fVar7 +
                  fStack_90c * fVar8,
                  fStack_590 * fVar1 + fStack_610 * fVar2 + fStack_690 * fVar3 + fStack_710 * fVar4
                  + fStack_790 * fVar5 + fStack_810 * fVar6 + fStack_890 * fVar7 +
                  fStack_910 * fVar8);
    *(ulong *)(input0 + 4) =
         CONCAT44(fStack_5b4 * fVar1 + fStack_634 * fVar2 + fStack_6b4 * fVar3 + fStack_734 * fVar4
                  + fStack_7b4 * fVar5 + fStack_834 * fVar6 + fStack_8b4 * fVar7 +
                  fStack_934 * fVar8,
                  local_5b8 * fVar1 + local_638 * fVar2 + local_6b8 * fVar3 + local_738 * fVar4 +
                  local_7b8 * fVar5 + local_838 * fVar6 + local_8b8 * fVar7 + local_938 * fVar8);
    *(ulong *)(input0 + 6) =
         CONCAT44(fStack_5ac * fVar1 + fStack_62c * fVar2 + fStack_6ac * fVar3 + fStack_72c * fVar4
                  + fStack_7ac * fVar5 + fStack_82c * fVar6 + fStack_8ac * fVar7 +
                  fStack_92c * fVar8,
                  fStack_5b0 * fVar1 + fStack_630 * fVar2 + fStack_6b0 * fVar3 + fStack_730 * fVar4
                  + fStack_7b0 * fVar5 + fStack_830 * fVar6 + fStack_8b0 * fVar7 +
                  fStack_930 * fVar8);
    *(ulong *)(input0 + 8) =
         CONCAT44(fStack_5d4 * fVar1 + fStack_654 * fVar2 + fStack_6d4 * fVar3 + fStack_754 * fVar4
                  + fStack_7d4 * fVar5 + fStack_854 * fVar6 + fStack_8d4 * fVar7 +
                  fStack_954 * fVar8,
                  local_5d8 * fVar1 + local_658 * fVar2 + local_6d8 * fVar3 + local_758 * fVar4 +
                  local_7d8 * fVar5 + local_858 * fVar6 + local_8d8 * fVar7 + local_958 * fVar8);
    *(ulong *)(input0 + 10) =
         CONCAT44(fStack_5cc * fVar1 + fStack_64c * fVar2 + fStack_6cc * fVar3 + fStack_74c * fVar4
                  + fStack_7cc * fVar5 + fStack_84c * fVar6 + fStack_8cc * fVar7 +
                  fStack_94c * fVar8,
                  fStack_5d0 * fVar1 + fStack_650 * fVar2 + fStack_6d0 * fVar3 + fStack_750 * fVar4
                  + fStack_7d0 * fVar5 + fStack_850 * fVar6 + fStack_8d0 * fVar7 +
                  fStack_950 * fVar8);
    *(ulong *)(input0 + 0xc) =
         CONCAT44(fStack_5f4 * fVar1 + fStack_674 * fVar2 + fStack_6f4 * fVar3 + fStack_774 * fVar4
                  + fStack_7f4 * fVar5 + fStack_874 * fVar6 + fStack_8f4 * fVar7 +
                  fStack_974 * fVar8,
                  local_5f8 * fVar1 + local_678 * fVar2 + local_6f8 * fVar3 + local_778 * fVar4 +
                  local_7f8 * fVar5 + local_878 * fVar6 + local_8f8 * fVar7 + local_978 * fVar8);
    *(ulong *)(input0 + 0xe) =
         CONCAT44(fStack_5ec * fVar1 + fStack_66c * fVar2 + fStack_6ec * fVar3 + fStack_76c * fVar4
                  + fStack_7ec * fVar5 + fStack_86c * fVar6 + fStack_8ec * fVar7 +
                  fStack_96c * fVar8,
                  fStack_5f0 * fVar1 + fStack_670 * fVar2 + fStack_6f0 * fVar3 + fStack_770 * fVar4
                  + fStack_7f0 * fVar5 + fStack_870 * fVar6 + fStack_8f0 * fVar7 +
                  fStack_970 * fVar8);
    input0 = input0 + 0x10;
    pfStack_ca8 = pfStack_ca8 + 0x10;
    pfStack_cb8 = pfStack_cb8 + 0x10;
    pfStack_cc8 = pfStack_cc8 + 0x10;
    pfStack_cd8 = pfStack_cd8 + 0x10;
    pfStack_ce8 = pfStack_ce8 + 0x10;
    pfStack_cf8 = pfStack_cf8 + 0x10;
    pfStack_d08 = pfStack_d08 + 0x10;
  }
  for (; 0xf < (long)input0_end - (long)pfStack_c98; pfStack_c98 = pfStack_c98 + 4) {
    local_998 = (float)*(undefined8 *)pfStack_c98;
    fStack_994 = (float)((ulong)*(undefined8 *)pfStack_c98 >> 0x20);
    fStack_990 = (float)*(undefined8 *)(pfStack_c98 + 2);
    fStack_98c = (float)((ulong)*(undefined8 *)(pfStack_c98 + 2) >> 0x20);
    local_9b8 = (float)*(undefined8 *)pfStack_ca8;
    fStack_9b4 = (float)((ulong)*(undefined8 *)pfStack_ca8 >> 0x20);
    fStack_9b0 = (float)*(undefined8 *)(pfStack_ca8 + 2);
    fStack_9ac = (float)((ulong)*(undefined8 *)(pfStack_ca8 + 2) >> 0x20);
    local_9d8 = (float)*(undefined8 *)pfStack_cb8;
    fStack_9d4 = (float)((ulong)*(undefined8 *)pfStack_cb8 >> 0x20);
    fStack_9d0 = (float)*(undefined8 *)(pfStack_cb8 + 2);
    fStack_9cc = (float)((ulong)*(undefined8 *)(pfStack_cb8 + 2) >> 0x20);
    local_9f8 = (float)*(undefined8 *)pfStack_cc8;
    fStack_9f4 = (float)((ulong)*(undefined8 *)pfStack_cc8 >> 0x20);
    fStack_9f0 = (float)*(undefined8 *)(pfStack_cc8 + 2);
    fStack_9ec = (float)((ulong)*(undefined8 *)(pfStack_cc8 + 2) >> 0x20);
    local_a18 = (float)*(undefined8 *)pfStack_cd8;
    fStack_a14 = (float)((ulong)*(undefined8 *)pfStack_cd8 >> 0x20);
    fStack_a10 = (float)*(undefined8 *)(pfStack_cd8 + 2);
    fStack_a0c = (float)((ulong)*(undefined8 *)(pfStack_cd8 + 2) >> 0x20);
    local_a38 = (float)*(undefined8 *)pfStack_ce8;
    fStack_a34 = (float)((ulong)*(undefined8 *)pfStack_ce8 >> 0x20);
    fStack_a30 = (float)*(undefined8 *)(pfStack_ce8 + 2);
    fStack_a2c = (float)((ulong)*(undefined8 *)(pfStack_ce8 + 2) >> 0x20);
    local_a58 = (float)*(undefined8 *)pfStack_cf8;
    fStack_a54 = (float)((ulong)*(undefined8 *)pfStack_cf8 >> 0x20);
    fStack_a50 = (float)*(undefined8 *)(pfStack_cf8 + 2);
    fStack_a4c = (float)((ulong)*(undefined8 *)(pfStack_cf8 + 2) >> 0x20);
    local_a78 = (float)*(undefined8 *)pfStack_d08;
    fStack_a74 = (float)((ulong)*(undefined8 *)pfStack_d08 >> 0x20);
    fStack_a70 = (float)*(undefined8 *)(pfStack_d08 + 2);
    fStack_a6c = (float)((ulong)*(undefined8 *)(pfStack_d08 + 2) >> 0x20);
    *(ulong *)input0 =
         CONCAT44(fStack_994 * fVar1 + fStack_9b4 * fVar2 + fStack_9d4 * fVar3 + fStack_9f4 * fVar4
                  + fStack_a14 * fVar5 + fStack_a34 * fVar6 + fStack_a54 * fVar7 +
                  fStack_a74 * fVar8,
                  local_998 * fVar1 + local_9b8 * fVar2 + local_9d8 * fVar3 + local_9f8 * fVar4 +
                  local_a18 * fVar5 + local_a38 * fVar6 + local_a58 * fVar7 + local_a78 * fVar8);
    *(ulong *)(input0 + 2) =
         CONCAT44(fStack_98c * fVar1 + fStack_9ac * fVar2 + fStack_9cc * fVar3 + fStack_9ec * fVar4
                  + fStack_a0c * fVar5 + fStack_a2c * fVar6 + fStack_a4c * fVar7 +
                  fStack_a6c * fVar8,
                  fStack_990 * fVar1 + fStack_9b0 * fVar2 + fStack_9d0 * fVar3 + fStack_9f0 * fVar4
                  + fStack_a10 * fVar5 + fStack_a30 * fVar6 + fStack_a50 * fVar7 +
                  fStack_a70 * fVar8);
    input0 = input0 + 4;
    pfStack_ca8 = pfStack_ca8 + 4;
    pfStack_cb8 = pfStack_cb8 + 4;
    pfStack_cc8 = pfStack_cc8 + 4;
    pfStack_cd8 = pfStack_cd8 + 4;
    pfStack_ce8 = pfStack_ce8 + 4;
    pfStack_cf8 = pfStack_cf8 + 4;
    pfStack_d08 = pfStack_d08 + 4;
  }
  for (; pfStack_c98 < input0_end; pfStack_c98 = pfStack_c98 + 1) {
    *input0 = *pfStack_d08 * fVar8 +
              *pfStack_cf8 * fVar7 +
              *pfStack_ce8 * fVar6 +
              *pfStack_cd8 * fVar5 +
              *pfStack_cc8 * fVar4 +
              *pfStack_cb8 * fVar3 + *pfStack_ca8 * fVar2 + *pfStack_c98 * fVar1;
    input0 = input0 + 1;
    pfStack_ca8 = pfStack_ca8 + 1;
    pfStack_cb8 = pfStack_cb8 + 1;
    pfStack_cc8 = pfStack_cc8 + 1;
    pfStack_cd8 = pfStack_cd8 + 1;
    pfStack_ce8 = pfStack_ce8 + 1;
    pfStack_cf8 = pfStack_cf8 + 1;
    pfStack_d08 = pfStack_d08 + 1;
  }
  return;
}

Assistant:

static void STBIR_chans( stbir__vertical_gather_with_,_coeffs)( float * outputp, float const * vertical_coefficients, float const ** inputs, float const * input0_end )
{
  float STBIR_SIMD_STREAMOUT_PTR( * ) output = outputp;

  stbIF0( float const * input0 = inputs[0]; float c0s = vertical_coefficients[0]; )
  stbIF1( float const * input1 = inputs[1]; float c1s = vertical_coefficients[1]; )
  stbIF2( float const * input2 = inputs[2]; float c2s = vertical_coefficients[2]; )
  stbIF3( float const * input3 = inputs[3]; float c3s = vertical_coefficients[3]; )
  stbIF4( float const * input4 = inputs[4]; float c4s = vertical_coefficients[4]; )
  stbIF5( float const * input5 = inputs[5]; float c5s = vertical_coefficients[5]; )
  stbIF6( float const * input6 = inputs[6]; float c6s = vertical_coefficients[6]; )
  stbIF7( float const * input7 = inputs[7]; float c7s = vertical_coefficients[7]; )

#if ( STBIR__vertical_channels == 1 ) && !defined(STB_IMAGE_RESIZE_VERTICAL_CONTINUE)
  // check single channel one weight
  if ( ( c0s >= (1.0f-0.000001f) ) && ( c0s <= (1.0f+0.000001f) ) )
  {
    STBIR_MEMCPY( output, input0, (char*)input0_end - (char*)input0 );
    return;
  }
#endif

  #ifdef STBIR_SIMD
  {
    stbIF0(stbir__simdfX c0 = stbir__simdf_frepX( c0s ); )
    stbIF1(stbir__simdfX c1 = stbir__simdf_frepX( c1s ); )
    stbIF2(stbir__simdfX c2 = stbir__simdf_frepX( c2s ); )
    stbIF3(stbir__simdfX c3 = stbir__simdf_frepX( c3s ); )
    stbIF4(stbir__simdfX c4 = stbir__simdf_frepX( c4s ); )
    stbIF5(stbir__simdfX c5 = stbir__simdf_frepX( c5s ); )
    stbIF6(stbir__simdfX c6 = stbir__simdf_frepX( c6s ); )
    stbIF7(stbir__simdfX c7 = stbir__simdf_frepX( c7s ); )

    STBIR_SIMD_NO_UNROLL_LOOP_START
    while ( ( (char*)input0_end - (char*) input0 ) >= (16*stbir__simdfX_float_count) )
    {
      stbir__simdfX o0, o1, o2, o3, r0, r1, r2, r3;
      STBIR_SIMD_NO_UNROLL(output);

      // prefetch four loop iterations ahead (doesn't affect much for small resizes, but helps with big ones)
      stbIF0( stbir__prefetch( input0 + (16*stbir__simdfX_float_count) ); )
      stbIF1( stbir__prefetch( input1 + (16*stbir__simdfX_float_count) ); )
      stbIF2( stbir__prefetch( input2 + (16*stbir__simdfX_float_count) ); )
      stbIF3( stbir__prefetch( input3 + (16*stbir__simdfX_float_count) ); )
      stbIF4( stbir__prefetch( input4 + (16*stbir__simdfX_float_count) ); )
      stbIF5( stbir__prefetch( input5 + (16*stbir__simdfX_float_count) ); )
      stbIF6( stbir__prefetch( input6 + (16*stbir__simdfX_float_count) ); )
      stbIF7( stbir__prefetch( input7 + (16*stbir__simdfX_float_count) ); )

      #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
      stbIF0( stbir__simdfX_load( o0, output );      stbir__simdfX_load( o1, output+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( o3, output+(3*stbir__simdfX_float_count) );
              stbir__simdfX_load( r0, input0 );      stbir__simdfX_load( r1, input0+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input0+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input0+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c0 );  stbir__simdfX_madd( o1, o1, r1, c0 );                         stbir__simdfX_madd( o2, o2, r2, c0 );                             stbir__simdfX_madd( o3, o3, r3, c0 ); )
      #else
      stbIF0( stbir__simdfX_load( r0, input0 );      stbir__simdfX_load( r1, input0+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input0+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input0+(3*stbir__simdfX_float_count) );
              stbir__simdfX_mult( o0, r0, c0 );      stbir__simdfX_mult( o1, r1, c0 );                             stbir__simdfX_mult( o2, r2, c0 );                                 stbir__simdfX_mult( o3, r3, c0 );  )
      #endif

      stbIF1( stbir__simdfX_load( r0, input1 );      stbir__simdfX_load( r1, input1+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input1+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input1+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c1 );  stbir__simdfX_madd( o1, o1, r1, c1 );                         stbir__simdfX_madd( o2, o2, r2, c1 );                             stbir__simdfX_madd( o3, o3, r3, c1 ); )
      stbIF2( stbir__simdfX_load( r0, input2 );      stbir__simdfX_load( r1, input2+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input2+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input2+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c2 );  stbir__simdfX_madd( o1, o1, r1, c2 );                         stbir__simdfX_madd( o2, o2, r2, c2 );                             stbir__simdfX_madd( o3, o3, r3, c2 ); )
      stbIF3( stbir__simdfX_load( r0, input3 );      stbir__simdfX_load( r1, input3+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input3+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input3+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c3 );  stbir__simdfX_madd( o1, o1, r1, c3 );                         stbir__simdfX_madd( o2, o2, r2, c3 );                             stbir__simdfX_madd( o3, o3, r3, c3 ); )
      stbIF4( stbir__simdfX_load( r0, input4 );      stbir__simdfX_load( r1, input4+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input4+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input4+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c4 );  stbir__simdfX_madd( o1, o1, r1, c4 );                         stbir__simdfX_madd( o2, o2, r2, c4 );                             stbir__simdfX_madd( o3, o3, r3, c4 ); )
      stbIF5( stbir__simdfX_load( r0, input5 );      stbir__simdfX_load( r1, input5+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input5+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input5+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c5 );  stbir__simdfX_madd( o1, o1, r1, c5 );                         stbir__simdfX_madd( o2, o2, r2, c5 );                             stbir__simdfX_madd( o3, o3, r3, c5 ); )
      stbIF6( stbir__simdfX_load( r0, input6 );      stbir__simdfX_load( r1, input6+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input6+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input6+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c6 );  stbir__simdfX_madd( o1, o1, r1, c6 );                         stbir__simdfX_madd( o2, o2, r2, c6 );                             stbir__simdfX_madd( o3, o3, r3, c6 ); )
      stbIF7( stbir__simdfX_load( r0, input7 );      stbir__simdfX_load( r1, input7+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input7+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input7+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c7 );  stbir__simdfX_madd( o1, o1, r1, c7 );                         stbir__simdfX_madd( o2, o2, r2, c7 );                             stbir__simdfX_madd( o3, o3, r3, c7 ); )

      stbir__simdfX_store( output, o0 );             stbir__simdfX_store( output+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output+(2*stbir__simdfX_float_count), o2 );  stbir__simdfX_store( output+(3*stbir__simdfX_float_count), o3 );
      output += (4*stbir__simdfX_float_count);
      stbIF0( input0 += (4*stbir__simdfX_float_count); ) stbIF1( input1 += (4*stbir__simdfX_float_count); ) stbIF2( input2 += (4*stbir__simdfX_float_count); ) stbIF3( input3 += (4*stbir__simdfX_float_count); ) stbIF4( input4 += (4*stbir__simdfX_float_count); ) stbIF5( input5 += (4*stbir__simdfX_float_count); ) stbIF6( input6 += (4*stbir__simdfX_float_count); ) stbIF7( input7 += (4*stbir__simdfX_float_count); )
    }

    STBIR_SIMD_NO_UNROLL_LOOP_START
    while ( ( (char*)input0_end - (char*) input0 ) >= 16 )
    {
      stbir__simdf o0, r0;
      STBIR_SIMD_NO_UNROLL(output);

      #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
      stbIF0( stbir__simdf_load( o0, output );   stbir__simdf_load( r0, input0 ); stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c0 ) ); )
      #else
      stbIF0( stbir__simdf_load( r0, input0 );  stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c0 ) ); )
      #endif
      stbIF1( stbir__simdf_load( r0, input1 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c1 ) ); )
      stbIF2( stbir__simdf_load( r0, input2 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c2 ) ); )
      stbIF3( stbir__simdf_load( r0, input3 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c3 ) ); )
      stbIF4( stbir__simdf_load( r0, input4 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c4 ) ); )
      stbIF5( stbir__simdf_load( r0, input5 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c5 ) ); )
      stbIF6( stbir__simdf_load( r0, input6 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c6 ) ); )
      stbIF7( stbir__simdf_load( r0, input7 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c7 ) ); )

      stbir__simdf_store( output, o0 );
      output += 4;
      stbIF0( input0 += 4; ) stbIF1( input1 += 4; ) stbIF2( input2 += 4; ) stbIF3( input3 += 4; ) stbIF4( input4 += 4; ) stbIF5( input5 += 4; ) stbIF6( input6 += 4; ) stbIF7( input7 += 4; )
    }
  }
  #else
  STBIR_NO_UNROLL_LOOP_START
  while ( ( (char*)input0_end - (char*) input0 ) >= 16 )
  {
    float o0, o1, o2, o3;
    STBIR_NO_UNROLL(output);
    #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
    stbIF0( o0 = output[0] + input0[0] * c0s; o1 = output[1] + input0[1] * c0s; o2 = output[2] + input0[2] * c0s; o3 = output[3] + input0[3] * c0s; )
    #else
    stbIF0( o0  = input0[0] * c0s; o1  = input0[1] * c0s; o2  = input0[2] * c0s; o3  = input0[3] * c0s; )
    #endif
    stbIF1( o0 += input1[0] * c1s; o1 += input1[1] * c1s; o2 += input1[2] * c1s; o3 += input1[3] * c1s; )
    stbIF2( o0 += input2[0] * c2s; o1 += input2[1] * c2s; o2 += input2[2] * c2s; o3 += input2[3] * c2s; )
    stbIF3( o0 += input3[0] * c3s; o1 += input3[1] * c3s; o2 += input3[2] * c3s; o3 += input3[3] * c3s; )
    stbIF4( o0 += input4[0] * c4s; o1 += input4[1] * c4s; o2 += input4[2] * c4s; o3 += input4[3] * c4s; )
    stbIF5( o0 += input5[0] * c5s; o1 += input5[1] * c5s; o2 += input5[2] * c5s; o3 += input5[3] * c5s; )
    stbIF6( o0 += input6[0] * c6s; o1 += input6[1] * c6s; o2 += input6[2] * c6s; o3 += input6[3] * c6s; )
    stbIF7( o0 += input7[0] * c7s; o1 += input7[1] * c7s; o2 += input7[2] * c7s; o3 += input7[3] * c7s; )
    output[0] = o0; output[1] = o1; output[2] = o2; output[3] = o3;
    output += 4;
    stbIF0( input0 += 4; ) stbIF1( input1 += 4; ) stbIF2( input2 += 4; ) stbIF3( input3 += 4; ) stbIF4( input4 += 4; ) stbIF5( input5 += 4; ) stbIF6( input6 += 4; ) stbIF7( input7 += 4; )
  }
  #endif
  STBIR_NO_UNROLL_LOOP_START
  while ( input0 < input0_end )
  {
    float o0;
    STBIR_NO_UNROLL(output);
    #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
    stbIF0( o0 = output[0] + input0[0] * c0s; )
    #else
    stbIF0( o0  = input0[0] * c0s; )
    #endif
    stbIF1( o0 += input1[0] * c1s; )
    stbIF2( o0 += input2[0] * c2s; )
    stbIF3( o0 += input3[0] * c3s; )
    stbIF4( o0 += input4[0] * c4s; )
    stbIF5( o0 += input5[0] * c5s; )
    stbIF6( o0 += input6[0] * c6s; )
    stbIF7( o0 += input7[0] * c7s; )
    output[0] = o0;
    ++output;
    stbIF0( ++input0; ) stbIF1( ++input1; ) stbIF2( ++input2; ) stbIF3( ++input3; ) stbIF4( ++input4; ) stbIF5( ++input5; ) stbIF6( ++input6; ) stbIF7( ++input7; )
  }
}